

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  long *in_R8;
  TableAndFile *tf;
  Status local_c8;
  Status local_c0;
  leveldb local_b8 [8];
  string old_fname;
  Status local_98;
  Table *local_90;
  Table *table;
  RandomAccessFile *file;
  string fname;
  undefined1 local_60 [8];
  Slice key;
  char local_39 [8];
  char buf [8];
  Handle **handle_local;
  uint64_t file_size_local;
  uint64_t file_number_local;
  TableCache *this_local;
  Status *s;
  
  buf[0] = '\0';
  unique0x10000310 = in_R8;
  Status::Status((Status *)this);
  EncodeFixed64(local_39,file_size);
  Slice::Slice((Slice *)local_60,local_39,8);
  lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))
                    (*(long **)(file_number + 0x30),local_60);
  *stack0xffffffffffffffd0 = lVar2;
  if (*stack0xffffffffffffffd0 == 0) {
    TableFileName((leveldb *)&file,(string *)(file_number + 8),file_size);
    table = (Table *)0x0;
    local_90 = (Table *)0x0;
    (**(code **)(**(long **)file_number + 0x18))(&local_98,*(long **)file_number,&file,&table);
    Status::operator=((Status *)this,&local_98);
    Status::~Status(&local_98);
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) {
      SSTTableFileName(local_b8,(string *)(file_number + 8),file_size);
      (**(code **)(**(long **)file_number + 0x18))(&local_c0,*(long **)file_number,local_b8,&table);
      bVar1 = Status::ok(&local_c0);
      Status::~Status(&local_c0);
      if (bVar1) {
        Status::OK();
        Status::operator=((Status *)this,&local_c8);
        Status::~Status(&local_c8);
      }
      std::__cxx11::string::~string((string *)local_b8);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      Table::Open((Table *)&tf,*(Options **)(file_number + 0x28),(RandomAccessFile *)table,
                  (uint64_t)handle,&local_90);
      Status::operator=((Status *)this,(Status *)&tf);
      Status::~Status((Status *)&tf);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = table;
      puVar3[1] = local_90;
      lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                        (*(long **)(file_number + 0x30),local_60,puVar3,1,DeleteEntry);
      *stack0xffffffffffffffd0 = lVar2;
    }
    else {
      if (local_90 != (Table *)0x0) {
        __assert_fail("table == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/table_cache.cc"
                      ,0x40,
                      "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)")
        ;
      }
      if (table != (Table *)0x0) {
        (**(code **)&(table->rep_->options).create_if_missing)();
      }
    }
    std::__cxx11::string::~string((string *)&file);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}